

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv_os_homedir(char *buffer,size_t *size)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  uv_passwd_t pwd;
  
  iVar1 = uv_os_getenv("HOME",buffer,size);
  if ((iVar1 == -2) && (iVar1 = uv__getpwuid_r(&pwd), iVar1 == 0)) {
    sVar2 = strlen(pwd.homedir);
    __n = sVar2 + 1;
    if (sVar2 < *size) {
      memcpy(buffer,pwd.homedir,__n);
      iVar1 = 0;
      __n = sVar2;
    }
    else {
      iVar1 = -0x69;
    }
    *size = __n;
    uv_os_free_passwd(&pwd);
  }
  return iVar1;
}

Assistant:

int uv_os_homedir(char* buffer, size_t* size) {
  uv_passwd_t pwd;
  size_t len;
  int r;

  /* Check if the HOME environment variable is set first. The task of
     performing input validation on buffer and size is taken care of by
     uv_os_getenv(). */
  r = uv_os_getenv("HOME", buffer, size);

  if (r != UV_ENOENT)
    return r;

  /* HOME is not set, so call uv__getpwuid_r() */
  r = uv__getpwuid_r(&pwd);

  if (r != 0) {
    return r;
  }

  len = strlen(pwd.homedir);

  if (len >= *size) {
    *size = len + 1;
    uv_os_free_passwd(&pwd);
    return UV_ENOBUFS;
  }

  memcpy(buffer, pwd.homedir, len + 1);
  *size = len;
  uv_os_free_passwd(&pwd);

  return 0;
}